

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Digit.hpp
# Opt level: O3

void Qentem::Digit::realToString<double,Qentem::StringStream<char>,unsigned_long_long>
               (StringStream<char> *stream,unsigned_long_long number,RealFormatInfo format)

{
  RealFormatType RVar1;
  bool round_up;
  SizeT32 SVar2;
  SizeT SVar3;
  ulong uVar4;
  ulong uVar5;
  unsigned_long_long *puVar6;
  BigInt<unsigned_long_long,_1216U> *pBVar7;
  uint uVar8;
  uint uVar9;
  char *from;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  char *to;
  long lVar14;
  unsigned_long_long uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  SizeT32 SVar20;
  ulong uVar21;
  long lVar22;
  byte bVar23;
  SizeT32 calculated_digits;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  SizeT new_length;
  SizeT SVar28;
  uint uVar29;
  bool bVar30;
  ulong local_108;
  uint local_ec;
  BigInt<unsigned_long_long,_1216U> local_d0;
  
  uVar13 = number & 0x7ff0000000000000;
  if (uVar13 == 0x7ff0000000000000) {
    if ((number & 0xfffffffffffff) == 0) {
      SVar3 = stream->length_;
      if ((long)number < 0) {
        SVar28 = SVar3 + 1;
        if (stream->capacity_ == SVar3) {
          StringStream<char>::expand(stream,SVar28);
          SVar3 = stream->length_;
        }
        stream->storage_[SVar3] = '-';
        stream->length_ = SVar28;
        SVar3 = SVar28;
      }
      uVar8 = SVar3 + 3;
      if (stream->capacity_ < uVar8) {
        StringStream<char>::expand(stream,uVar8);
        SVar3 = stream->length_;
      }
      to = stream->storage_ + SVar3;
      from = "inf";
    }
    else {
      uVar19 = stream->length_;
      uVar8 = uVar19 + 3;
      if (stream->capacity_ < uVar8) {
        StringStream<char>::expand(stream,uVar8);
        uVar19 = stream->length_;
      }
      to = stream->storage_ + uVar19;
      from = "nan";
    }
    uVar19 = 3;
LAB_00112446:
    Memory::Copy<unsigned_int>(to,from,uVar19);
    stream->length_ = uVar8;
    return;
  }
  if ((long)number < 0) {
    uVar8 = stream->length_;
    SVar3 = uVar8 + 1;
    if (stream->capacity_ == uVar8) {
      StringStream<char>::expand(stream,SVar3);
      uVar8 = stream->length_;
    }
    stream->storage_[uVar8] = '-';
    stream->length_ = SVar3;
  }
  uVar8 = format.Precision;
  RVar1 = format.Type;
  if ((number & 0x7fffffffffffffff) == 0) {
    uVar19 = stream->length_;
    SVar3 = uVar19 + 1;
    uVar9 = uVar19;
    if (stream->capacity_ == uVar19) {
      StringStream<char>::expand(stream,SVar3);
      uVar9 = stream->length_;
    }
    stream->storage_[uVar9] = '0';
    stream->length_ = SVar3;
    if (RVar1 != Fixed) {
      return;
    }
    SVar28 = uVar19 + 2;
    if (stream->capacity_ == SVar3) {
      StringStream<char>::expand(stream,SVar28);
      SVar3 = stream->length_;
    }
    stream->storage_[SVar3] = '.';
    stream->length_ = SVar28;
    if (0x13 < uVar8) {
      uVar8 = uVar19 + 0x15;
      do {
        SVar28 = uVar8;
        if (stream->capacity_ < SVar28) {
          StringStream<char>::expand(stream,SVar28);
          uVar8 = stream->length_;
        }
        else {
          uVar8 = SVar28 - 0x13;
        }
        Memory::Copy<unsigned_int>(stream->storage_ + uVar8,"0000000000000000000",0x13);
        stream->length_ = SVar28;
        format.Precision = format.Precision - 0x13;
        format._4_4_ = 0;
        uVar8 = SVar28 + 0x13;
      } while (0x13 < format.Precision);
    }
    uVar19 = format.Precision;
    uVar8 = uVar19 + SVar28;
    if (stream->capacity_ < uVar8) {
      StringStream<char>::expand(stream,uVar8);
      SVar28 = stream->length_;
    }
    to = stream->storage_ + SVar28;
    from = "0000000000000000000";
    goto LAB_00112446;
  }
  local_d0.storage_[0x11] = 0;
  local_d0.storage_[0x12] = 0;
  local_d0.storage_[9] = 0;
  local_d0.storage_[10] = 0;
  local_d0.storage_[0xb] = 0;
  local_d0.storage_[0xc] = 0;
  local_d0.storage_[0xd] = 0;
  local_d0.storage_[0xe] = 0;
  local_d0.storage_[0xf] = 0;
  local_d0.storage_[0x10] = 0;
  local_d0.storage_[1] = 0;
  local_d0.storage_[2] = 0;
  local_d0.storage_[3] = 0;
  local_d0.storage_[4] = 0;
  local_d0.storage_[5] = 0;
  local_d0.storage_[6] = 0;
  local_d0.storage_[7] = 0;
  local_d0.storage_[8] = 0;
  uVar4 = (number & 0xfffffffffffff) + 0x10000000000000;
  uVar5 = (number & 0xfffffffffffff) * 2;
  if (uVar13 != 0) {
    uVar5 = uVar4;
  }
  uVar10 = 0;
  for (uVar25 = uVar5; (uVar25 & 1) == 0; uVar25 = uVar25 >> 1 | 0x8000000000000000) {
    uVar10 = uVar10 + 1;
  }
  local_d0.storage_[0] = uVar5;
  local_d0.index_ = 0;
  uVar9 = 0x34 - (int)uVar10;
  uVar19 = 0;
  if (uVar13 == 0) {
    uVar19 = uVar9;
  }
  uVar11 = (uint)(uVar13 >> 0x34);
  uVar16 = 0x3ff - uVar11;
  uVar11 = uVar11 - 0x3ff;
  uVar29 = uVar16;
  if (0x3fe0000000000000 < uVar13) {
    uVar29 = uVar11;
  }
  uVar19 = (uVar19 + uVar29) * 0x7597 >> 5;
  calculated_digits = uVar19 / 0xc35 + 1;
  bVar23 = RVar1 - Scientific;
  uVar19 = uVar19 / 0xc35;
  if ((uVar13 < 0x3fe0000000000001) || (uVar29 < uVar9 && (0xfd < bVar23 || uVar19 < uVar8))) {
    SVar2 = calculated_digits;
    if (0x3fe0000000000000 < uVar13) {
      uVar16 = -uVar11;
      SVar2 = 0;
      if (bVar23 < 0xfe) {
        SVar2 = calculated_digits;
      }
      SVar2 = -SVar2;
    }
    uVar9 = uVar9 + uVar16;
    uVar16 = uVar8 + SVar2 + 1;
    bVar30 = uVar16 <= uVar9;
    round_up = bVar30 && uVar9 - uVar16 != 0;
    uVar19 = uVar9 - uVar16;
    if (!bVar30) {
      uVar19 = 0;
    }
    local_108 = (ulong)uVar19;
    if (!bVar30) {
      uVar16 = uVar9;
    }
    if (uVar10 != 0) {
      local_d0.storage_[0] = uVar5 >> (uVar10 & 0x3f);
    }
    uVar19 = uVar16;
    if (0x1a < uVar16) {
      local_ec = 0x12;
      if (uVar8 < 300) {
        local_ec = (uVar8 & 0xffff) / 0x13 + 2;
      }
      uVar9 = 0;
      uVar29 = 0;
      do {
        uVar5 = (ulong)-uVar29;
        uVar10 = (ulong)uVar29;
        uVar4 = (ulong)(uVar29 + 1);
        do {
          uVar11 = (int)uVar4 - 1;
          uVar25 = (ulong)uVar11;
          lVar14 = 0;
          if (uVar4 < 0x14) {
            lVar14 = 0x13 - uVar4;
          }
          uVar21 = local_d0.storage_[uVar25] & 0xffffffff;
          uVar26 = uVar21 * 0xfa10079d;
          uVar24 = local_d0.storage_[uVar25] >> 0x20;
          uVar27 = (uVar26 >> 0x20) + uVar24 * 0xfa10079d;
          uVar21 = uVar21 * 0x6765c793 + (uVar27 & 0xffffffff);
          lVar22 = (uVar21 >> 0x20) + (uVar27 >> 0x20) + uVar24 * 0x6765c793;
          local_d0.storage_[uVar25] = uVar21 << 0x20 | uVar26 & 0xffffffff;
          if (lVar22 != 0) {
            lVar18 = 0;
            do {
              if (lVar14 == lVar18) {
                uVar9 = 0;
                uVar29 = 0;
                uVar10 = 0;
                goto LAB_001121f7;
              }
              uVar21 = local_d0.storage_[uVar4 + lVar18];
              uVar24 = lVar22 + uVar21;
              local_d0.storage_[uVar4 + lVar18] = uVar24;
              lVar18 = lVar18 + 1;
              lVar22 = 1;
            } while (uVar24 <= uVar21);
            uVar17 = (uint)(lVar18 - uVar5);
            if ((uint)uVar10 < uVar17) {
              uVar10 = lVar18 - uVar5 & 0xffffffff;
              uVar9 = uVar17;
              uVar29 = uVar17;
            }
          }
LAB_001121f7:
          uVar5 = uVar5 + 1;
          uVar4 = uVar25;
        } while (uVar11 != 0);
        if ((local_ec <= uVar29) && (0x3f < (uint)local_108)) {
          if (uVar29 == 0) {
            uVar29 = 0;
            local_d0.storage_[0] = 0;
          }
          else {
            uVar9 = uVar29 + 1;
            if (uVar9 < 3) {
              uVar9 = 2;
            }
            memmove(&local_d0,local_d0.storage_ + 1,(ulong)(uVar9 - 1) << 3);
            uVar9 = uVar29 - 1;
            local_d0.storage_[uVar29] = 0;
            uVar29 = uVar9;
          }
          local_108 = (ulong)((uint)local_108 - 0x40);
        }
        uVar19 = uVar19 - 0x1b;
      } while (0x1a < uVar19);
      local_d0.index_ = uVar9;
    }
    if (uVar19 != 0) {
      iVar12 = -local_d0.index_;
      uVar10 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfFive(unsigned_int)::PowerOfFive +
                         (ulong)uVar19 * 8) & 0xffffffff;
      uVar5 = *(ulong *)(DigitUtils::DigitConst<8u>::GetPowerOfFive(unsigned_int)::PowerOfFive +
                        (ulong)uVar19 * 8) >> 0x20;
      uVar4 = (ulong)(local_d0.index_ + 1);
      SVar2 = local_d0.index_;
      SVar20 = local_d0.index_;
      do {
        uVar19 = (int)uVar4 - 1;
        uVar25 = (ulong)uVar19;
        lVar14 = 0x13 - uVar4;
        if (0x13 < uVar4) {
          lVar14 = 0;
        }
        uVar24 = local_d0.storage_[uVar25] & 0xffffffff;
        uVar26 = uVar24 * uVar10;
        uVar21 = local_d0.storage_[uVar25] >> 0x20;
        uVar27 = (uVar26 >> 0x20) + uVar21 * uVar10;
        uVar24 = uVar24 * uVar5 + (uVar27 & 0xffffffff);
        lVar22 = (uVar24 >> 0x20) + (uVar27 >> 0x20) + uVar21 * uVar5;
        local_d0.storage_[uVar25] = uVar24 << 0x20 | uVar26 & 0xffffffff;
        uVar9 = SVar20;
        if (lVar22 != 0) {
          lVar18 = 0;
          do {
            if (lVar14 == lVar18) {
              SVar2 = 0;
              uVar9 = 0;
              goto LAB_0011235b;
            }
            uVar21 = local_d0.storage_[uVar4 + lVar18];
            uVar24 = lVar22 + uVar21;
            local_d0.storage_[uVar4 + lVar18] = uVar24;
            lVar18 = lVar18 + 1;
            lVar22 = 1;
          } while (uVar24 <= uVar21);
          uVar9 = (int)lVar18 - iVar12;
          if (SVar20 < uVar9) {
            SVar2 = uVar9;
          }
          if (uVar9 < SVar20) {
            uVar9 = SVar20;
          }
        }
LAB_0011235b:
        SVar20 = uVar9;
        iVar12 = iVar12 + 1;
        uVar4 = uVar25;
      } while (uVar19 != 0);
      local_d0.index_ = SVar2;
    }
    if (0x3f < (uint)local_108) {
      uVar4 = local_108 >> 6;
      if (local_d0.index_ < (uint)uVar4) {
        if (local_d0.index_ != 0) {
          memset((void *)((long)&local_d0 +
                         ((ulong)local_d0.index_ - (ulong)(local_d0.index_ - 1)) * 8),0,
                 (ulong)local_d0.index_ * 8);
          local_d0.index_ = 0;
        }
        local_d0.storage_[0] = 0;
        goto LAB_0011260f;
      }
      local_108 = (ulong)((uint)local_108 & 0x3f);
      pBVar7 = &local_d0;
      uVar5 = uVar4;
      do {
        puVar6 = local_d0.storage_ + uVar5;
        uVar19 = (int)uVar5 + 1;
        uVar5 = (ulong)uVar19;
        pBVar7->storage_[0] = *puVar6;
        pBVar7 = (BigInt<unsigned_long_long,_1216U> *)(pBVar7->storage_ + 1);
      } while (uVar19 <= local_d0.index_);
      do {
        uVar5 = (ulong)local_d0.index_;
        local_d0.index_ = local_d0.index_ - 1;
        uVar19 = (int)uVar4 - 1;
        uVar4 = (ulong)uVar19;
        local_d0.storage_[uVar5] = 0;
      } while (uVar19 != 0);
    }
    if ((int)local_108 != 0) {
      uVar4 = local_d0.storage_[0] >> (local_108 & 0x3f);
      local_d0.storage_[0] = uVar4;
      if (local_d0.index_ == 0) {
        iVar12 = 0;
      }
      else {
        uVar5 = 0;
        do {
          uVar25 = local_d0.storage_[uVar5 + 1] << ((ulong)(0x40 - (int)local_108) & 0x3f) | uVar4;
          uVar4 = local_d0.storage_[uVar5 + 1] >> (local_108 & 0x3f);
          uVar10 = uVar5 + 1;
          local_d0.storage_[uVar5] = uVar25;
          local_d0.storage_[uVar5 + 1] = uVar4;
          uVar5 = uVar10;
        } while (local_d0.index_ != uVar10);
        iVar12 = -(uint)(local_d0.storage_[local_d0.index_] == 0);
      }
      local_d0.index_ = iVar12 + local_d0.index_;
    }
    goto LAB_0011260f;
  }
  SVar2 = 0;
  if (0xfd >= bVar23 && uVar19 >= uVar8) {
    SVar2 = uVar19 - uVar8;
  }
  uVar19 = SVar2 + 0x34;
  if (uVar19 < uVar11) {
    uVar9 = uVar11 - uVar19;
    uVar10 = (ulong)uVar9;
    if (uVar9 < 0x40) {
      if (uVar11 != uVar19) {
        pBVar7 = &local_d0;
        uVar21 = (ulong)(0x40 - uVar9);
        local_d0.storage_[0] = uVar4 << (uVar10 & 0x3f);
        uVar19 = 0;
LAB_00112593:
        uVar5 = uVar5 >> (uVar21 & 0x3f);
        local_d0.index_ = (uVar19 + 1) - (uint)(uVar5 == 0);
        local_d0.storage_[local_d0.index_] = local_d0.storage_[local_d0.index_] | uVar5;
        if (uVar19 != 0) {
          uVar15 = pBVar7->storage_[0];
LAB_001125b7:
          puVar6 = local_d0.storage_ + (uVar19 - 1);
          do {
            uVar4 = *puVar6;
            uVar5 = (ulong)uVar19;
            uVar19 = uVar19 - 1;
            local_d0.storage_[uVar5] = uVar4 >> (uVar21 & 0x3f) | uVar15;
            uVar15 = uVar4 << (uVar10 & 0x3f);
            *puVar6 = uVar15;
            puVar6 = puVar6 + -1;
          } while (uVar19 != 0);
        }
      }
    }
    else {
      if (0x4bf < uVar9) goto LAB_001124fb;
      uVar19 = uVar9 >> 6;
      uVar9 = uVar9 & 0x3f;
      uVar10 = (ulong)uVar9;
      local_d0.storage_[uVar19] = uVar4;
      memset(&local_d0,0,(ulong)(uVar19 - 1) * 8 + 8);
      uVar4 = (ulong)uVar19;
      do {
        uVar25 = uVar4;
        uVar19 = (uint)uVar25;
        uVar5 = local_d0.storage_[uVar25];
        uVar4 = (ulong)(uVar19 - 1);
      } while (uVar5 == 0);
      local_d0.index_ = uVar19;
      if (uVar9 != 0) {
        uVar15 = uVar5 << uVar10;
        uVar21 = (ulong)(0x40 - uVar9);
        local_d0.storage_[uVar25] = uVar15;
        if (uVar19 - 1 != 0x11) {
          pBVar7 = (BigInt<unsigned_long_long,_1216U> *)(local_d0.storage_ + uVar25);
          goto LAB_00112593;
        }
        uVar19 = 0x12;
        goto LAB_001125b7;
      }
    }
  }
  else if (uVar19 - uVar11 < 0x40) {
    if (uVar19 != uVar11) {
      local_d0.storage_[0] = uVar4 >> ((ulong)(uVar19 - uVar11) & 0x3f);
    }
  }
  else {
LAB_001124fb:
    local_d0.storage_[0] = 0;
  }
  uVar16 = 0;
  if (SVar2 == 0) {
    round_up = false;
  }
  else {
    bigIntDropDigits<Qentem::BigInt<unsigned_long_long,1216u>>(&local_d0,SVar2);
    round_up = true;
  }
LAB_0011260f:
  SVar3 = stream->length_;
  bigIntToString<Qentem::StringStream<char>,Qentem::BigInt<unsigned_long_long,1216u>>
            (stream,&local_d0);
  if (RVar1 == Fixed) {
    formatStringNumberFixed<true,Qentem::StringStream<char>>
              (stream,SVar3,uVar8,calculated_digits,uVar16,round_up);
    return;
  }
  if ((format._4_4_ & 0xff) == 2) {
    formatStringNumberFixed<false,Qentem::StringStream<char>>
              (stream,SVar3,uVar8,calculated_digits,uVar16,round_up);
    return;
  }
  formatStringNumberDefault<Qentem::StringStream<char>>
            (stream,SVar3,uVar8,calculated_digits,uVar16,0x3fe0000000000000 < uVar13,round_up);
  return;
}

Assistant:

static void realToString(Stream_T &stream, const Number_T number, const RealFormatInfo format) {
        constexpr SizeT32 number_size = sizeof(Number_T);

        using Info_T = DigitUtils::RealNumberInfo<Float_T, number_size>;
        // 4.9406564584124654e-324 needs about 1216 bits to store all its digits.
        using BigIntSys  = BigInt<SystemIntType, ((Info_T::Bias + 1U) + (number_size * 8U * 3U))>;
        using DigitConst = DigitUtils::DigitConst<BigIntSys::SizeOfType()>;

        const Number_T bias = (number & Info_T::ExponentMask);

        if (bias != Info_T::ExponentMask) {
            if ((number & Info_T::SignMask) != 0) {
                stream += DigitUtils::DigitChar::Negative;
            }

            Number_T mantissa = (number & Info_T::MantissaMask);

            if ((mantissa != 0) || (bias != 0)) {
                if (bias != 0) {
                    mantissa |= Info_T::LeadingBit;
                } else {
                    mantissa <<= 1U;
                }

                BigIntSys b_int{mantissa};
                /////////////////////////////////////
                const SizeT32 first_shift      = Platform::FindFirstBit(mantissa);
                const int     exponent         = (int)((bias >> Info_T::MantissaSize) - Info_T::Bias);
                const bool    is_positive_exp  = (exponent >= 0);
                const SizeT32 positive_exp     = SizeT32(is_positive_exp ? exponent : -exponent);
                const SizeT32 first_bit        = (Info_T::MantissaSize - first_shift);
                const SizeT32 exp_actual_value = (positive_exp + ((bias == 0) * first_bit));
                const SizeT32 digits           = (((exp_actual_value * 30103U) / 100000) + 1U);
                SizeT32       fraction_length  = 0;
                const bool    fixed =
                    ((format.Type == RealFormatType::SemiFixed) | (format.Type == RealFormatType::Fixed));
                const bool extra_digits = ((digits > format.Precision) & !fixed);
                const bool big_offset   = (positive_exp >= first_bit);
                const bool no_fraction  = (is_positive_exp & (big_offset | extra_digits));
                bool       round_up     = false;
                /////////////////////////////////////
                if (no_fraction) {
                    const SizeT32 drop    = ((!extra_digits) ? 0 : (digits - (format.Precision + 1U)));
                    const SizeT32 m_shift = (Info_T::MantissaSize + drop);

                    if (m_shift < positive_exp) {
                        b_int <<= (positive_exp - m_shift);
                    } else {
                        b_int >>= (m_shift - positive_exp);
                    }

                    if (drop != 0) {
                        round_up = true;
                        bigIntDropDigits(b_int, drop);
                    }
                } else {
                    SizeT32 shift   = 0;
                    SizeT32 needed  = 0;
                    fraction_length = first_bit;

                    if (is_positive_exp) {
                        fraction_length -= positive_exp;

                        if (fixed) {
                            needed = format.Precision;
                        } else {
                            needed = (format.Precision - digits);
                        }
                    } else {
                        fraction_length += positive_exp;
                        needed = (digits + format.Precision);
                    }

                    ++needed; // For rounding.

                    if (fraction_length > needed) {
                        shift           = (fraction_length - needed);
                        fraction_length = needed;
                        round_up        = true;
                    }

                    b_int >>= first_shift;

                    SizeT32 times = fraction_length;

                    if (times >= DigitConst::MaxPowerOfFive) {
                        const SizeT32 max_index = (format.Precision < Info_T::MaxCut)
                                                      ? ((format.Precision / DigitConst::MaxPowerOfTen) + 2U)
                                                      : b_int.MaxIndex();

                        do {
                            b_int *= DigitConst::GetPowerOfFive(DigitConst::MaxPowerOfFive);

                            if ((b_int.Index() >= max_index) && (shift >= DigitConst::MaxShift)) {
                                b_int >>= DigitConst::MaxShift;
                                shift -= DigitConst::MaxShift;
                            }

                            times -= DigitConst::MaxPowerOfFive;
                        } while (times >= DigitConst::MaxPowerOfFive);
                    }

                    if (times != 0) {
                        b_int *= DigitConst::GetPowerOfFive(times);
                    }

                    b_int >>= shift;
                }

                const SizeT start_at = stream.Length();
                bigIntToString(stream, b_int);

                switch (format.Type) {
                    case RealFormatType::SemiFixed: {
                        formatStringNumberFixed<false>(stream, start_at, format.Precision, digits, fraction_length,
                                                       round_up);
                        break;
                    }

                    case RealFormatType::Fixed: {
                        formatStringNumberFixed<true>(stream, start_at, format.Precision, digits, fraction_length,
                                                      round_up);
                        break;
                    }

                    default: {
                        formatStringNumberDefault(stream, start_at, format.Precision, digits, fraction_length,
                                                  is_positive_exp, round_up);
                    }
                }

            } else {
                stream += DigitUtils::DigitChar::Zero;

                if (format.Type == RealFormatType::Fixed) {
                    stream += DigitUtils::DigitChar::Dot;
                    insertZerosLarge(stream, format.Precision);
                }
            }
        } else {
            using Char_T           = typename Stream_T::CharType;
            constexpr SizeT32 size = sizeof(Char_T);
            using DigitString      = DigitUtils::DigitString<Char_T, size>;

            if ((number & Info_T::MantissaMask) == 0) {
                if ((number & Info_T::SignMask) != 0) {
                    stream += DigitUtils::DigitChar::Negative;
                }

                stream.Write(DigitString::Infinity, DigitString::InfinityLength);
            } else {
                stream.Write(DigitString::NotANumber, DigitString::NotANumberLength);
            }
        }
    }